

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::bitcast_glsl_abi_cxx11_
          (CompilerGLSL *this,SPIRType *result_type,uint32_t argument)

{
  SPIRType *pSVar1;
  ulong uVar2;
  uint32_t in_ECX;
  undefined4 in_register_00000014;
  undefined1 local_78 [56];
  string op;
  uint32_t argument_local;
  SPIRType *result_type_local;
  CompilerGLSL *this_local;
  
  pSVar1 = Compiler::expression_type((Compiler *)result_type,in_ECX);
  (*(result_type->super_IVariant)._vptr_IVariant[0x34])
            (local_78 + 0x30,result_type,CONCAT44(in_register_00000014,argument),pSVar1);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    to_unpacked_expression_abi_cxx11_
              ((CompilerGLSL *)local_78,(uint32_t)result_type,SUB41(in_ECX,0));
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_78 + 0x30),(char (*) [2])0x4f3f9c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
               (char (*) [2])0x4dff7a);
    ::std::__cxx11::string::~string((string *)local_78);
  }
  else {
    to_enclosed_unpacked_expression_abi_cxx11_(this,(uint32_t)result_type,SUB41(in_ECX,0));
  }
  local_78._32_4_ = 1;
  ::std::__cxx11::string::~string((string *)(local_78 + 0x30));
  return this;
}

Assistant:

string CompilerGLSL::bitcast_glsl(const SPIRType &result_type, uint32_t argument)
{
	auto op = bitcast_glsl_op(result_type, expression_type(argument));
	if (op.empty())
		return to_enclosed_unpacked_expression(argument);
	else
		return join(op, "(", to_unpacked_expression(argument), ")");
}